

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateExpandDimsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *this_00;
  uint32 uVar1;
  uint uVar2;
  bool bVar3;
  ExpandDimsLayerParams *pEVar4;
  int64 iVar5;
  iterator iVar6;
  Type *pTVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  int iVar9;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string err_1;
  int a;
  undefined4 uStack_c4;
  int *piStack_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_8c;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&axes_set,layer,1,1);
  Result::operator=(&r,(Result *)&axes_set);
  this_00 = &axes_set._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)this_00);
  bVar3 = Result::good(&r);
  if (bVar3) {
    validateOutputCount((Result *)&axes_set,layer,1,1);
    Result::operator=(&r,(Result *)&axes_set);
    std::__cxx11::string::~string((string *)&axes_set._M_t._M_impl.super__Rb_tree_header);
  }
  pEVar4 = Specification::NeuralNetworkLayer::expanddims(layer);
  if ((pEVar4->axes_).current_size_ == 0) {
    std::__cxx11::string::string((string *)&local_108,(string *)(layer->name_).ptr_);
    std::operator+(&err_1,"ExpandDims Layer \'",&local_108);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&axes_set,
                   &err_1,"\': length of the \'axes\' parameter cannot be 0.");
    std::__cxx11::string::~string((string *)&err_1);
    std::__cxx11::string::~string((string *)&local_108);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&axes_set);
    std::__cxx11::string::~string((string *)&axes_set);
    goto LAB_002555e2;
  }
  axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar9 = 0;
  axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
  axes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
  while( true ) {
    pEVar4 = Specification::NeuralNetworkLayer::expanddims(layer);
    if ((pEVar4->axes_).current_size_ <= iVar9) break;
    pEVar4 = Specification::NeuralNetworkLayer::expanddims(layer);
    iVar5 = Specification::ExpandDimsLayerParams::axes(pEVar4,iVar9);
    _a = (pointer)CONCAT44(uStack_c4,(int)iVar5);
    iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)&axes_set,&a);
    if ((_Rb_tree_header *)iVar6._M_node != this_00) {
      std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
      std::operator+(&local_108,"ExpandDims Layer \'",&local_b0);
      std::operator+(&err_1,&local_108,
                     "\': all the values in the \'axes\' parameter must be unique.");
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_b0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
      goto LAB_00255494;
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&axes_set
               ,&a);
    iVar9 = iVar9 + 1;
  }
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) {
LAB_002554df:
    Result::Result(__return_storage_ptr__,&r);
  }
  else {
    pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    uVar1 = pTVar7->rank_;
    pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
    uVar2 = pTVar7->rank_;
    pEVar4 = Specification::NeuralNetworkLayer::expanddims(layer);
    iVar9 = (pEVar4->axes_).current_size_;
    if (uVar1 + iVar9 == uVar2) {
      _a = (pointer)0x0;
      piStack_c0 = (int *)0x0;
      local_b8 = (pointer)0x0;
      index = 0;
      if (iVar9 < 1) {
        iVar9 = index;
      }
      for (; iVar9 != index; index = index + 1) {
        pEVar4 = Specification::NeuralNetworkLayer::expanddims(layer);
        iVar5 = Specification::ExpandDimsLayerParams::axes(pEVar4,index);
        local_8c = ((int)iVar5 >> 0x1f & uVar2) + (int)iVar5;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (_a,piStack_c0,&local_8c);
        if (_Var8._M_current != piStack_c0) {
          std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
          std::operator+(&local_108,"ExpandDims Layer \'",&local_b0);
          std::operator+(&err_1,&local_108,
                         "\': axes parameter list cannot have the same value more than once.");
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_b0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
          goto LAB_002555c1;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&a,&local_8c);
      }
      _Var8 = std::
              __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_a,piStack_c0);
      iVar9 = *_Var8._M_current;
      _Var8 = std::
              __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_a,piStack_c0);
      if ((iVar9 < (int)uVar2) && (-1 < *_Var8._M_current)) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&a);
        goto LAB_002554df;
      }
      std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
      std::operator+(&local_108,"ExpandDims Layer \'",&local_b0);
      std::operator+(&err_1,&local_108,
                     "\': axes refers to a dimension that exceeds the output rank.");
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_b0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_002555c1:
      std::__cxx11::string::~string((string *)&err_1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&a);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,(string *)(layer->name_).ptr_);
      std::operator+(&local_108,"ExpandDims Layer \'",&local_b0);
      std::operator+(&err_1,&local_108,
                     "\': input rank plus the length of the axes parameter must equal output rank.")
      ;
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_b0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
LAB_00255494:
      std::__cxx11::string::~string((string *)&err_1);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&axes_set._M_t);
LAB_002555e2:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateExpandDimsLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.expanddims().axes_size() == 0) {
        std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // either all values in axes must be positive or all negative
    std::set<int> axes_set;
    for (int i=0; i<layer.expanddims().axes_size(); i++) {
        int a = (int)layer.expanddims().axes(i);
        if (axes_set.find(a) != axes_set.end()) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else {
            axes_set.insert(a);
        }
    }

    if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
        int input_rank = static_cast<int>(layer.inputtensor(0).rank());
        int output_rank = static_cast<int>(layer.outputtensor(0).rank());
        int axes_length = layer.expanddims().axes_size();

        if (input_rank + axes_length != output_rank) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': input rank plus the length of the axes parameter must equal output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        std::vector<int> axes;
        for (int i=0; i<axes_length; i++) {
            int a = (int)layer.expanddims().axes(i);
            if (a < 0) {
                a = output_rank + a;
            }
            if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
            axes.push_back(a);
        }

        int max_value = *std::max_element(axes.begin(), axes.end());
        int min_value = *std::min_element(axes.begin(), axes.end());
        if (max_value > output_rank - 1 || min_value < 0) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}